

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_raw.c
# Opt level: O1

void test_read_format_raw(void)

{
  int iVar1;
  wchar_t wVar2;
  archive_conflict *paVar3;
  char *pcVar4;
  la_ssize_t lVar5;
  time_t v1;
  archive_entry *ae;
  char buff [512];
  archive_entry *local_240;
  undefined1 local_238 [520];
  
  extract_reference_file("test_read_format_raw.data");
  paVar3 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                   ,L',',(uint)(paVar3 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'-',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar3);
  iVar1 = archive_read_support_format_all((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'.',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar3);
  iVar1 = archive_read_support_format_raw((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'/',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_raw(a)",paVar3);
  wVar2 = archive_read_open_filename(paVar3,"test_read_format_raw.data",0x200);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'1',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, reffile1, 512)",paVar3);
  iVar1 = archive_read_next_header((archive *)paVar3,&local_240);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'4',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  pcVar4 = archive_entry_pathname(local_240);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
             ,L'5',"data","\"data\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  wVar2 = archive_entry_size_is_set(local_240);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                   ,L'7',(uint)(wVar2 == L'\0'),"!archive_entry_size_is_set(ae)",(void *)0x0);
  wVar2 = archive_entry_atime_is_set(local_240);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                   ,L'8',(uint)(wVar2 == L'\0'),"!archive_entry_atime_is_set(ae)",(void *)0x0);
  wVar2 = archive_entry_ctime_is_set(local_240);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                   ,L'9',(uint)(wVar2 == L'\0'),"!archive_entry_ctime_is_set(ae)",(void *)0x0);
  wVar2 = archive_entry_mtime_is_set(local_240);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                   ,L':',(uint)(wVar2 == L'\0'),"!archive_entry_mtime_is_set(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(local_240);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L';',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'<',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar3);
  lVar5 = archive_read_data((archive *)paVar3,local_238,0x20);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'=',4,"4",lVar5,"archive_read_data(a, buff, 32)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'>',local_238,"buff","foo\n","\"foo\\n\"",4,"4",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)paVar3,&local_240);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'A',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  iVar1 = archive_read_close((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'B',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar3);
  iVar1 = archive_read_free((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'C',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  extract_reference_file("test_read_format_raw.data.Z");
  paVar3 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                   ,L'H',(uint)(paVar3 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'I',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar3);
  iVar1 = archive_read_support_format_by_code((archive *)paVar3,0x90000);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'J',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_support_format_by_code(a, ARCHIVE_FORMAT_RAW)",paVar3);
  iVar1 = archive_read_support_format_all((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'K',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar3);
  wVar2 = archive_read_open_filename(paVar3,"test_read_format_raw.data.Z",1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'M',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, reffile2, 1)",
                      paVar3);
  iVar1 = archive_read_next_header((archive *)paVar3,&local_240);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'P',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  pcVar4 = archive_entry_pathname(local_240);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
             ,L'Q',"data","\"data\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  wVar2 = archive_entry_is_encrypted(local_240);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'R',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'S',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar3);
  wVar2 = archive_entry_size_is_set(local_240);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                   ,L'U',(uint)(wVar2 == L'\0'),"!archive_entry_size_is_set(ae)",(void *)0x0);
  wVar2 = archive_entry_atime_is_set(local_240);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                   ,L'V',(uint)(wVar2 == L'\0'),"!archive_entry_atime_is_set(ae)",(void *)0x0);
  wVar2 = archive_entry_ctime_is_set(local_240);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                   ,L'W',(uint)(wVar2 == L'\0'),"!archive_entry_ctime_is_set(ae)",(void *)0x0);
  wVar2 = archive_entry_mtime_is_set(local_240);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                   ,L'X',(uint)(wVar2 == L'\0'),"!archive_entry_mtime_is_set(ae)",(void *)0x0);
  lVar5 = archive_read_data((archive *)paVar3,local_238,0x20);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'Y',4,"4",lVar5,"archive_read_data(a, buff, 32)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'Z',local_238,"buff","foo\n","\"foo\\n\"",4,"4",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)paVar3,&local_240);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L']',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  iVar1 = archive_read_close((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'^',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar3);
  iVar1 = archive_read_free((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'_',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  extract_reference_file("test_read_format_raw.bufr");
  paVar3 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                   ,L'd',(uint)(paVar3 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'e',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar3);
  iVar1 = archive_read_set_format((archive *)paVar3,0x90000);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'f',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_set_format(a, ARCHIVE_FORMAT_RAW)",paVar3);
  wVar2 = archive_read_open_filename(paVar3,"test_read_format_raw.bufr",1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'h',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, reffile3, 1)",
                      paVar3);
  iVar1 = archive_read_next_header((archive *)paVar3,&local_240);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'k',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  pcVar4 = archive_entry_pathname(local_240);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
             ,L'l',"data","\"data\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  wVar2 = archive_entry_is_encrypted(local_240);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'm',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'n',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar3);
  wVar2 = archive_entry_size_is_set(local_240);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                   ,L'p',(uint)(wVar2 == L'\0'),"!archive_entry_size_is_set(ae)",(void *)0x0);
  wVar2 = archive_entry_atime_is_set(local_240);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                   ,L'q',(uint)(wVar2 == L'\0'),"!archive_entry_atime_is_set(ae)",(void *)0x0);
  wVar2 = archive_entry_ctime_is_set(local_240);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                   ,L'r',(uint)(wVar2 == L'\0'),"!archive_entry_ctime_is_set(ae)",(void *)0x0);
  wVar2 = archive_entry_mtime_is_set(local_240);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                   ,L's',(uint)(wVar2 == L'\0'),"!archive_entry_mtime_is_set(ae)",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)paVar3,&local_240);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'v',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  iVar1 = archive_read_close((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'w',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar3);
  iVar1 = archive_read_free((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'x',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  extract_reference_file("test_read_format_raw.data.gz");
  paVar3 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                   ,L'}',(uint)(paVar3 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'~',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar3);
  iVar1 = archive_read_support_format_raw((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'\x7f',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_raw(a)",
                      paVar3);
  iVar1 = archive_read_support_format_all((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'\x80',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                      paVar3);
  wVar2 = archive_read_open_filename(paVar3,"test_read_format_raw.data.gz",1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'\x82',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, reffile4, 1)",paVar3);
  iVar1 = archive_read_next_header((archive *)paVar3,&local_240);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'\x85',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3)
  ;
  pcVar4 = archive_entry_pathname(local_240);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
             ,L'\x86',"test-file-name.data","\"test-file-name.data\"",pcVar4,
             "archive_entry_pathname(ae)",(void *)0x0,L'\0');
  wVar2 = archive_entry_is_encrypted(local_240);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'\x87',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'\x88',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar3);
  wVar2 = archive_entry_mtime_is_set(local_240);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                   ,L'\x89',wVar2,"archive_entry_mtime_is_set(ae)",(void *)0x0);
  v1 = archive_entry_mtime(local_240);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'\x8a',v1,"archive_entry_mtime(ae)",0x5cbafd25,"0x5cbafd25",paVar3);
  wVar2 = archive_entry_size_is_set(local_240);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                   ,L'\x8c',(uint)(wVar2 == L'\0'),"!archive_entry_size_is_set(ae)",(void *)0x0);
  wVar2 = archive_entry_atime_is_set(local_240);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                   ,L'\x8d',(uint)(wVar2 == L'\0'),"!archive_entry_atime_is_set(ae)",(void *)0x0);
  wVar2 = archive_entry_ctime_is_set(local_240);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                   ,L'\x8e',(uint)(wVar2 == L'\0'),"!archive_entry_ctime_is_set(ae)",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)paVar3,&local_240);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'\x91',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3
                     );
  iVar1 = archive_read_close((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'\x92',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar3);
  iVar1 = archive_read_free((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_raw.c"
                      ,L'\x93',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_raw)
{
	char buff[512];
	struct archive_entry *ae;
	struct archive *a;
	const char *reffile1 = "test_read_format_raw.data";
	const char *reffile2 = "test_read_format_raw.data.Z";
	const char *reffile3 = "test_read_format_raw.bufr";
#ifdef HAVE_ZLIB_H
	const char *reffile4 = "test_read_format_raw.data.gz";
#endif

	/* First, try pulling data out of an uninterpretable file. */
	extract_reference_file(reffile1);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_raw(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, reffile1, 512));

	/* First (and only!) Entry */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("data", archive_entry_pathname(ae));
	/* Most fields should be unset (unknown) */
	assert(!archive_entry_size_is_set(ae));
	assert(!archive_entry_atime_is_set(ae));
	assert(!archive_entry_ctime_is_set(ae));
	assert(!archive_entry_mtime_is_set(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualInt(4, archive_read_data(a, buff, 32));
	assertEqualMem(buff, "foo\n", 4);

	/* Test EOF */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));


	/* Second, try the same with a compressed file. */
	extract_reference_file(reffile2);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_by_code(a, ARCHIVE_FORMAT_RAW));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, reffile2, 1));

	/* First (and only!) Entry */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("data", archive_entry_pathname(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	/* Most fields should be unset (unknown) */
	assert(!archive_entry_size_is_set(ae));
	assert(!archive_entry_atime_is_set(ae));
	assert(!archive_entry_ctime_is_set(ae));
	assert(!archive_entry_mtime_is_set(ae));
	assertEqualInt(4, archive_read_data(a, buff, 32));
	assertEqualMem(buff, "foo\n", 4);

	/* Test EOF */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));


	/* Third, try with file which fooled us in past - appeared to be tar. */
	extract_reference_file(reffile3);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_set_format(a, ARCHIVE_FORMAT_RAW));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, reffile3, 1));

	/* First (and only!) Entry */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("data", archive_entry_pathname(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	/* Most fields should be unset (unknown) */
	assert(!archive_entry_size_is_set(ae));
	assert(!archive_entry_atime_is_set(ae));
	assert(!archive_entry_ctime_is_set(ae));
	assert(!archive_entry_mtime_is_set(ae));

	/* Test EOF */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

#ifdef HAVE_ZLIB_H
	/* Fourth, try with gzip which has metadata. */
	extract_reference_file(reffile4);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_raw(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, reffile4, 1));

	/* First (and only!) Entry */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("test-file-name.data", archive_entry_pathname(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assert(archive_entry_mtime_is_set(ae));
	assertEqualIntA(a, archive_entry_mtime(ae), 0x5cbafd25);
	/* Most fields should be unset (unknown) */
	assert(!archive_entry_size_is_set(ae));
	assert(!archive_entry_atime_is_set(ae));
	assert(!archive_entry_ctime_is_set(ae));

	/* Test EOF */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
#endif
}